

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testURI.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char **ppcVar5;
  uint uVar6;
  uint uVar7;
  char str [1024];
  undefined8 uStack_430;
  char acStack_428 [1032];
  
  uVar6 = 1;
  if ((1 < argc) && (argv[1] != (char *)0x0)) {
    uStack_430 = 0x10125e;
    iVar1 = strcmp(argv[1],"--relative");
    if (iVar1 == 0) {
      relative = relative + 1;
      uVar6 = 2;
    }
  }
  uVar7 = uVar6;
  if (((int)uVar6 < argc) && (pcVar2 = argv[uVar6], pcVar2 != (char *)0x0)) {
    uStack_430 = 0x10128e;
    iVar1 = strcmp(pcVar2,"-base");
    if (iVar1 != 0) {
      uStack_430 = 0x1012a1;
      iVar1 = strcmp(pcVar2,"--base");
      if (iVar1 != 0) goto LAB_001012bf;
    }
    base = argv[uVar6 + 1];
    uVar7 = uVar6 + 2;
    if (base == (char *)0x0) {
      uVar7 = uVar6 + 1;
    }
  }
LAB_001012bf:
  if (((int)uVar7 < argc) && (pcVar2 = argv[uVar7], pcVar2 != (char *)0x0)) {
    uStack_430 = 0x1012df;
    iVar1 = strcmp(pcVar2,"-escape");
    if (iVar1 != 0) {
      uStack_430 = 0x1012f2;
      iVar1 = strcmp(pcVar2,"--escape");
      if (iVar1 != 0) goto LAB_001012ff;
    }
    uVar7 = uVar7 + 1;
    escape = escape + 1;
  }
LAB_001012ff:
  if (((int)uVar7 < argc) && (pcVar2 = argv[uVar7], pcVar2 != (char *)0x0)) {
    uStack_430 = 0x10131f;
    iVar1 = strcmp(pcVar2,"-debug");
    if (iVar1 != 0) {
      uStack_430 = 0x101332;
      iVar1 = strcmp(pcVar2,"--debug");
      if (iVar1 != 0) goto LAB_0010133f;
    }
    uVar7 = uVar7 + 1;
    debug = debug + 1;
  }
LAB_0010133f:
  pcVar2 = argv[uVar7];
  if (pcVar2 == (char *)0x0) {
    uStack_430 = 0x10137d;
    pcVar2 = fgets(acStack_428,0x3ff,_stdin);
    while (pcVar2 != (char *)0x0) {
      uStack_430 = 0x101397;
      sVar3 = strlen(acStack_428);
      if (0 < (int)(uint)sVar3) {
        uVar4 = (ulong)((uint)sVar3 & 0x7fffffff) + 1;
        do {
          if ((0x20 < (ulong)(byte)acStack_428[uVar4 - 2]) ||
             ((0x100002600U >> ((ulong)(byte)acStack_428[uVar4 - 2] & 0x3f) & 1) == 0)) break;
          acStack_428[uVar4 - 2] = '\0';
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      uStack_430 = 0x1013ca;
      handleURI(acStack_428);
      uStack_430 = 0x1013da;
      pcVar2 = fgets(acStack_428,0x3ff,_stdin);
    }
  }
  else {
    ppcVar5 = argv + uVar7;
    do {
      ppcVar5 = ppcVar5 + 1;
      uStack_430 = 0x101358;
      handleURI(pcVar2);
      pcVar2 = *ppcVar5;
    } while (pcVar2 != (char *)0x0);
  }
  uStack_430 = 0x1013e4;
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int i, arg = 1;

    if ((argc > arg) && (argv[arg] != NULL) &&
	(!strcmp(argv[arg], "--relative"))) {
	arg++;
	relative++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-base")) || (!strcmp(argv[arg], "--base")))) {
	arg++;
	base = argv[arg];
	if (base != NULL)
	    arg++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-escape")) || (!strcmp(argv[arg], "--escape")))) {
	arg++;
	escape++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-debug")) || (!strcmp(argv[arg], "--debug")))) {
	arg++;
	debug++;
    }
    if (argv[arg] == NULL) {
	char str[1024];

        while (1) {
	    /*
	     * read one line in string buffer.
	     */
	    if (fgets (&str[0], sizeof (str) - 1, stdin) == NULL)
	       break;

	    /*
	     * remove the ending spaces
	     */
	    i = strlen(str);
	    while ((i > 0) &&
		   ((str[i - 1] == '\n') || (str[i - 1] == '\r') ||
		    (str[i - 1] == ' ') || (str[i - 1] == '\t'))) {
		i--;
		str[i] = 0;
	    }
	    handleURI(str);
        }
    } else {
	while (argv[arg] != NULL) {
	    handleURI(argv[arg]);
	    arg++;
	}
    }
    xmlMemoryDump();
    return(0);
}